

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptNumber.cpp
# Opt level: O2

Var Js::JavascriptNumber::EntryToExponential(RecyclableObject *function,CallInfo callInfo,...)

{
  Type TVar1;
  ScriptContext *pSVar2;
  code *pcVar3;
  bool bVar4;
  BOOL BVar5;
  uint formatDigits;
  int iVar6;
  undefined4 *puVar7;
  Var pvVar8;
  JavascriptString *pJVar9;
  RecyclableObject *pRVar10;
  double dVar11;
  int in_stack_00000010;
  undefined1 local_70 [8];
  Type TStack_68;
  CallInfo local_60;
  CallInfo callInfo_local;
  double value;
  Var result;
  undefined1 auStack_40 [8];
  ArgumentReader args;
  
  pSVar2 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  local_60 = callInfo;
  ThreadContext::ProbeStack(pSVar2->threadContext,0xc00,pSVar2,(PVOID)0x0);
  if (callInfo._0_4_ != in_stack_00000010) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar7 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptNumber.cpp"
                                ,0x227,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar4) goto LAB_00b8b5dd;
    *puVar7 = 0;
  }
  ArgumentReader::ArgumentReader((ArgumentReader *)auStack_40,&local_60,(Var *)&stack0x00000018);
  pSVar2 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  if (((ulong)local_60 & 0x1000000) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar7 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptNumber.cpp"
                                ,0x22a,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar4) goto LAB_00b8b5dd;
    *puVar7 = 0;
  }
  if ((auStack_40._0_4_ & 0xffffff) != 0) {
    pvVar8 = Arguments::operator[]((Arguments *)auStack_40,0);
    BVar5 = GetThisValue(pvVar8,(double *)&callInfo_local);
    if (BVar5 != 0) {
      result = (Var)callInfo_local;
      pJVar9 = ToStringNanOrInfinite((double)callInfo_local,pSVar2);
      if (pJVar9 != (JavascriptString *)0x0) {
        return pJVar9;
      }
      formatDigits = 0xffffffff;
      if ((auStack_40._0_4_ & 0xfffffe) != 0) {
        pvVar8 = Arguments::operator[]((Arguments *)auStack_40,1);
        bVar4 = TaggedInt::Is(pvVar8);
        if (bVar4) {
          formatDigits = TaggedInt::ToInt32(pvVar8);
        }
        else {
          if (pvVar8 == (Var)0x0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
            *puVar7 = 1;
            bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                        ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
            if (!bVar4) goto LAB_00b8b5dd;
            *puVar7 = 0;
          }
          bVar4 = TaggedInt::Is(pvVar8);
          if ((ulong)pvVar8 >> 0x32 == 0 && !bVar4) {
            pRVar10 = UnsafeVarTo<Js::RecyclableObject>(pvVar8);
            if (pRVar10 == (RecyclableObject *)0x0) {
              AssertCount = AssertCount + 1;
              Throw::LogAssert();
              puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
              *puVar7 = 1;
              bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                          ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
              if (!bVar4) goto LAB_00b8b5dd;
              *puVar7 = 0;
            }
            TVar1 = ((pRVar10->type).ptr)->typeId;
            if ((int)TVar1 < 0x58) {
              if (TVar1 == TypeIds_Undefined) goto LAB_00b8b54f;
            }
            else {
              BVar5 = RecyclableObject::IsExternal(pRVar10);
              if (BVar5 == 0) {
                AssertCount = AssertCount + 1;
                Throw::LogAssert();
                puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
                *puVar7 = 1;
                bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                            ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                            "GetTypeId aValue has invalid TypeId");
                if (!bVar4) goto LAB_00b8b5dd;
                *puVar7 = 0;
              }
            }
          }
          dVar11 = JavascriptConversion::ToInteger(pvVar8,pSVar2);
          formatDigits = (uint)dVar11;
        }
        if (0x14 < formatDigits) {
          JavascriptError::ThrowRangeError(pSVar2,-0x7ff5ec5e,(PCWSTR)0x0);
        }
      }
LAB_00b8b54f:
      pvVar8 = FormatDoubleToString((double)result,FormatExponential,formatDigits,pSVar2);
      return pvVar8;
    }
    pvVar8 = Arguments::operator[]((Arguments *)auStack_40,0);
    if (pvVar8 == (Var)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar7 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
      if (!bVar4) goto LAB_00b8b5dd;
      *puVar7 = 0;
    }
    bVar4 = TaggedInt::Is(pvVar8);
    if (((ulong)pvVar8 >> 0x32 != 0) || (bVar4)) goto LAB_00b8b5c9;
    pRVar10 = UnsafeVarTo<Js::RecyclableObject>(pvVar8);
    if (pRVar10 == (RecyclableObject *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar7 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
      if (!bVar4) goto LAB_00b8b5dd;
      *puVar7 = 0;
    }
    TVar1 = ((pRVar10->type).ptr)->typeId;
    if ((int)TVar1 < 0x58) {
      if (TVar1 == TypeIds_HostDispatch) {
        pvVar8 = Arguments::operator[]((Arguments *)auStack_40,0);
        pRVar10 = VarTo<Js::RecyclableObject>(pvVar8);
        TStack_68 = args.super_Arguments.Info;
        iVar6 = (*(pRVar10->super_FinalizableObject).super_IRecyclerVisitedObject.
                  _vptr_IRecyclerVisitedObject[0x55])(pRVar10,EntryToExponential,local_70,&value);
        if (iVar6 != 0) {
          return (Var)value;
        }
      }
    }
    else {
      BVar5 = RecyclableObject::IsExternal(pRVar10);
      if (BVar5 == 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar7 = 1;
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                    "GetTypeId aValue has invalid TypeId");
        if (!bVar4) {
LAB_00b8b5dd:
          pcVar3 = (code *)invalidInstructionException();
          (*pcVar3)();
        }
        *puVar7 = 0;
      }
    }
  }
LAB_00b8b5c9:
  JavascriptError::ThrowTypeError(pSVar2,-0x7ff5ec3c,L"Number.prototype.toExponential");
}

Assistant:

Var JavascriptNumber::EntryToExponential(RecyclableObject* function, CallInfo callInfo, ...)
    {
        PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

        ARGUMENTS(args, callInfo);
        ScriptContext* scriptContext = function->GetScriptContext();

        Assert(!(callInfo.Flags & CallFlags_New));

        if (args.Info.Count == 0)
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_This_NeedNumber, _u("Number.prototype.toExponential"));
        }

        AssertMsg(args.Info.Count > 0, "negative arg count");

        // spec implies ToExp is not generic. 'this' must be a number
        double value;
        if (!GetThisValue(args[0], &value))
        {
            if (JavascriptOperators::GetTypeId(args[0]) == TypeIds_HostDispatch)
            {
                Var result;
                if (VarTo<RecyclableObject>(args[0])->InvokeBuiltInOperationRemotely(EntryToExponential, args, &result))
                {
                    return result;
                }
            }

            JavascriptError::ThrowTypeError(scriptContext, JSERR_This_NeedNumber, _u("Number.prototype.toExponential"));
        }

        JavascriptString * nanF;
        if (nullptr != (nanF = ToStringNanOrInfinite(value, scriptContext)))
            return nanF;

        // If the Fraction param. is not present we have to output as many fractional digits as we can
        int fractionDigits = -1;

        if(args.Info.Count > 1)
        {
            //use the first arg as the fraction digits, ignore the rest.
            Var aFractionDigits = args[1];
            bool noRangeCheck = false;

            // shortcut for tagged int's
            if(TaggedInt::Is(aFractionDigits))
            {
                fractionDigits = TaggedInt::ToInt32(aFractionDigits);
            }
            else if(JavascriptOperators::GetTypeId(aFractionDigits) == TypeIds_Undefined)
            {
                // fraction undefined -> digits = -1, output as many fractional digits as we can
                noRangeCheck = true;
            }
            else
            {
                fractionDigits = (int)JavascriptConversion::ToInteger(aFractionDigits, scriptContext);
            }
            if(!noRangeCheck && (fractionDigits < 0 || fractionDigits >20))
            {
                JavascriptError::ThrowRangeError(scriptContext, JSERR_FractionOutOfRange);
            }
        }

        return FormatDoubleToString(value, Js::NumberUtilities::FormatExponential, fractionDigits, scriptContext);
    }